

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::ParsedIR::get_member_decoration
          (ParsedIR *this,TypeID id,uint32_t index,Decoration decoration)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  Decoration *pDVar4;
  Decoration *dec;
  Meta *local_28;
  Meta *m;
  Decoration decoration_local;
  uint32_t index_local;
  ParsedIR *this_local;
  TypeID id_local;
  
  m._0_4_ = decoration;
  m._4_4_ = index;
  _decoration_local = this;
  this_local._0_4_ = id.id;
  TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)1>
            ((TypedID<(spirv_cross::Types)0> *)((long)&dec + 4),
             (TypedID<(spirv_cross::Types)1> *)&this_local);
  local_28 = find_meta(this,dec._4_4_);
  if (local_28 == (Meta *)0x0) {
    this_local._4_4_ = BuiltInPosition;
  }
  else {
    uVar2 = (ulong)m._4_4_;
    sVar3 = VectorView<spirv_cross::Meta::Decoration>::size
                      (&(local_28->members).super_VectorView<spirv_cross::Meta::Decoration>);
    if (uVar2 < sVar3) {
      pDVar4 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                         (&(local_28->members).super_VectorView<spirv_cross::Meta::Decoration>,
                          (ulong)m._4_4_);
      bVar1 = Bitset::get(&pDVar4->decoration_flags,(Decoration)m);
      if (bVar1) {
        switch((Decoration)m) {
        case DecorationSpecId:
          this_local._4_4_ = pDVar4->spec_id;
          break;
        default:
          this_local._4_4_ = BuiltInPointSize;
          break;
        case DecorationBuiltIn:
          this_local._4_4_ = pDVar4->builtin_type;
          break;
        case DecorationStream:
          this_local._4_4_ = pDVar4->stream;
          break;
        case DecorationLocation:
          this_local._4_4_ = pDVar4->location;
          break;
        case DecorationComponent:
          this_local._4_4_ = pDVar4->component;
          break;
        case DecorationIndex:
          this_local._4_4_ = pDVar4->index;
          break;
        case DecorationBinding:
          this_local._4_4_ = pDVar4->binding;
          break;
        case DecorationOffset:
          this_local._4_4_ = pDVar4->offset;
          break;
        case DecorationXfbBuffer:
          this_local._4_4_ = pDVar4->xfb_buffer;
          break;
        case DecorationXfbStride:
          this_local._4_4_ = pDVar4->xfb_stride;
        }
      }
      else {
        this_local._4_4_ = BuiltInPosition;
      }
    }
    else {
      this_local._4_4_ = BuiltInPosition;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t ParsedIR::get_member_decoration(TypeID id, uint32_t index, Decoration decoration) const
{
	auto *m = find_meta(id);
	if (!m)
		return 0;

	if (index >= m->members.size())
		return 0;

	auto &dec = m->members[index];
	if (!dec.decoration_flags.get(decoration))
		return 0;

	switch (decoration)
	{
	case DecorationBuiltIn:
		return dec.builtin_type;
	case DecorationLocation:
		return dec.location;
	case DecorationComponent:
		return dec.component;
	case DecorationBinding:
		return dec.binding;
	case DecorationOffset:
		return dec.offset;
	case DecorationXfbBuffer:
		return dec.xfb_buffer;
	case DecorationXfbStride:
		return dec.xfb_stride;
	case DecorationStream:
		return dec.stream;
	case DecorationSpecId:
		return dec.spec_id;
	case DecorationIndex:
		return dec.index;
	default:
		return 1;
	}
}